

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O0

_Bool borg_load_formulas(ang_file *fp)

{
  bool bVar1;
  _Bool _Var2;
  char *s;
  size_t sVar3;
  char *line;
  int local_420;
  _Bool skip_open;
  e_section section;
  _Bool formulas_off;
  char buf [1024];
  ang_file *fp_local;
  
  local_420 = 0;
  bVar1 = true;
  borg_formulas.restock.count = 0;
  borg_formulas.depth.count = 0;
  borg_formulas.power.count = 0;
  skip_open = borg_cfg[0xd] == 0;
  buf._1016_8_ = fp;
  while (_Var2 = file_getl((ang_file *)buf._1016_8_,(char *)&section,0x3ff), _Var2) {
    s = borg_trim((char *)&section);
    if ((*s != '\0') && (*s != '#')) {
      _Var2 = prefix_i(s,"[END FORMULA SECTION]");
      if (_Var2) break;
      if (skip_open == false) {
        if (*s == '[') {
          if (!bVar1) {
            skip_open = true;
          }
          bVar1 = false;
        }
        else if (*s == ']') {
          if (local_420 == 0) {
            return false;
          }
          local_420 = 0;
        }
        else {
          _Var2 = prefix_i(s,"Power");
          if (_Var2) {
            if (local_420 != 0) {
              skip_open = true;
            }
            local_420 = 1;
            bVar1 = true;
          }
          else {
            _Var2 = prefix_i(s,"Depth Requirement");
            if (_Var2) {
              if (local_420 != 0) {
                skip_open = true;
              }
              local_420 = 2;
              bVar1 = true;
            }
            else {
              _Var2 = prefix_i(s,"Restock Requirement");
              if (_Var2) {
                if (local_420 != 0) {
                  skip_open = true;
                }
                local_420 = 3;
                bVar1 = true;
              }
              else {
                sVar3 = strlen(s);
                if (s[sVar3 - 1] == ';') {
                  if (local_420 == 2) {
                    skip_open = parse_depth_line(false,s,(char *)&section);
                  }
                  if (local_420 == 3) {
                    skip_open = parse_depth_line(true,s,(char *)&section);
                  }
                  if (local_420 == 1) {
                    skip_open = parse_power_line(s,(char *)&section);
                  }
                  if (local_420 == 0) {
                    borg_formula_error((char *)&section,(char *)&section,"base",
                                       "** line must be part of a Power or Depth section");
                    skip_open = true;
                  }
                }
                else {
                  if (local_420 == 2) {
                    borg_formula_error((char *)&section,(char *)&section,"depth",
                                       "** line must end in a ;");
                  }
                  else if (local_420 == 1) {
                    borg_formula_error((char *)&section,(char *)&section,"power",
                                       "** line must end in a ;");
                  }
                  else if (local_420 == 3) {
                    borg_formula_error((char *)&section,(char *)&section,"restock",
                                       "** line must end in a ;");
                  }
                  else {
                    borg_formula_error((char *)&section,(char *)&section,"base",
                                       "** line must end in a ;");
                  }
                  skip_open = true;
                }
              }
            }
          }
        }
      }
    }
  }
  if ((skip_open != false) && (borg_cfg[0xd] != 0)) {
    borg_cfg[0xd] = 0;
  }
  return skip_open;
}

Assistant:

bool borg_load_formulas(ang_file *fp)
{
    enum e_section { SEC_NONE, SEC_POWER, SEC_DEPTH, SEC_RESTOCK };

    char           buf[1024];
    bool           formulas_off = false;
    enum e_section section      = SEC_NONE;
    bool           skip_open    = true;

    borg_formulas.restock.count = 0;
    borg_formulas.depth.count   = 0;
    borg_formulas.power.count   = 0;

    /* read but don't process formulas if we aren't using them */
    if (!borg_cfg[BORG_USES_DYNAMIC_CALCS])
        formulas_off = true;

    /* Parse the formula section of the file */
    while (file_getl(fp, buf, sizeof(buf) - 1)) {

        char *line = borg_trim(buf);

        /* Skip comments and blank lines */
        if (!line[0] || (line[0] == '#'))
            continue;

        if (prefix_i(line, "[END FORMULA SECTION]"))
            break;

        /* if we failed anywhere */
        if (formulas_off)
            continue;

        /* sections are bounded in [] */
        if (line[0] == '[') {
            if (!skip_open)
                formulas_off = true;

            skip_open = false;
            continue;
        }
        if (line[0] == ']') {
            if (section == SEC_NONE)
                return formulas_off;
            section = SEC_NONE;
            continue;
        }

        /* if we failed anywhere */
        if (formulas_off)
            continue;

        if (prefix_i(line, "Power")) {
            if (section != SEC_NONE)
                formulas_off = true;

            section   = SEC_POWER;
            skip_open = true;
            continue;
        }
        if (prefix_i(line, "Depth Requirement")) {
            if (section != SEC_NONE)
                formulas_off = true;

            section   = SEC_DEPTH;
            skip_open = true;
            continue;
        }
        if (prefix_i(line, "Restock Requirement")) {
            if (section != SEC_NONE)
                formulas_off = true;

            section   = SEC_RESTOCK;
            skip_open = true;
            continue;
        }

        /* lines must end in ; */
        if (line[strlen(line) - 1] != ';') {
            if (section == SEC_DEPTH)
                borg_formula_error(
                    buf, buf, "depth", "** line must end in a ;");
            else if (section == SEC_POWER)
                borg_formula_error(
                    buf, buf, "power", "** line must end in a ;");
            else if (section == SEC_RESTOCK)
                borg_formula_error(
                    buf, buf, "restock", "** line must end in a ;");
            else
                borg_formula_error(buf, buf, "base", "** line must end in a ;");
            formulas_off = true;
        } else {
            if (section == SEC_DEPTH)
                formulas_off = parse_depth_line(false, line, buf);
            if (section == SEC_RESTOCK)
                formulas_off = parse_depth_line(true, line, buf);
            if (section == SEC_POWER)
                formulas_off = parse_power_line(line, buf);
            if (section == SEC_NONE) {
                borg_formula_error(buf, buf, "base",
                    "** line must be part of a Power or Depth section");
                formulas_off = true;
            }
        }
    }
    if (formulas_off && borg_cfg[BORG_USES_DYNAMIC_CALCS])
        borg_cfg[BORG_USES_DYNAMIC_CALCS] = false;

    return formulas_off;
}